

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeak(MemoryLeakDetectorTable *this,MemLeakPeriod period)

{
  long lVar1;
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar2;
  
  lVar1 = 0;
  do {
    pMVar2 = this->table_[lVar1].head_;
    if (pMVar2 != (MemoryLeakDetectorNode *)0x0 && period != mem_leak_period_all) {
      do {
        if ((*(MemLeakPeriod *)(pMVar2 + 0x30) == period) ||
           (period == mem_leak_period_enabled &&
            *(MemLeakPeriod *)(pMVar2 + 0x30) != mem_leak_period_disabled)) break;
        pMVar2 = *(MemoryLeakDetectorNode **)(pMVar2 + 0x38);
      } while (pMVar2 != (MemoryLeakDetectorNode *)0x0);
    }
    if (pMVar2 != (MemoryLeakDetectorNode *)0x0) {
      return pMVar2;
    }
    lVar1 = lVar1 + 1;
    if (lVar1 == 0x49) {
      return (MemoryLeakDetectorNode *)0x0;
    }
  } while( true );
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeak(MemLeakPeriod period)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}